

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O1

bool __thiscall USDFParser::ParseIfItem(USDFParser *this,FStrifeDialogueNode *node)

{
  uint *puVar1;
  uint uVar2;
  FStrifeDialogueItemCheck *pFVar3;
  bool bVar4;
  int iVar5;
  undefined8 in_RAX;
  PClassActor *p;
  PClassInventory *pPVar6;
  FName key;
  undefined1 auStack_38 [8];
  
  auStack_38 = (undefined1  [8])in_RAX;
  bVar4 = FScanner::CheckToken((FScanner *)this,0x7d);
  iVar5 = -1;
  pPVar6 = (PClassInventory *)0x0;
  if (!bVar4) {
    do {
      UDMFParserBase::ParseKey((UDMFParserBase *)(auStack_38 + 4),SUB81(this,0),(bool *)0x0);
      if ((long)(int)auStack_38._4_4_ == 0x1e9) {
        iVar5 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e9].Text);
      }
      else if (auStack_38._4_4_ == 0x29) {
        p = CheckActorType(this,FName::NameData.NameArray[(int)auStack_38._4_4_].Text);
        pPVar6 = dyn_cast<PClassInventory>((DObject *)p);
      }
      bVar4 = FScanner::CheckToken((FScanner *)this,0x7d);
    } while (!bVar4);
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Grow(&node->ItemCheck,1);
  pFVar3 = (node->ItemCheck).Array;
  uVar2 = (node->ItemCheck).Count;
  pFVar3[uVar2].Item = pPVar6;
  pFVar3[uVar2].Amount = iVar5;
  puVar1 = &(node->ItemCheck).Count;
  *puVar1 = *puVar1 + 1;
  return true;
}

Assistant:

bool ParseIfItem(FStrifeDialogueNode *node)
	{
		FStrifeDialogueItemCheck check;
		check.Item = NULL;
		check.Amount = -1;

		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Item:
				check.Item = dyn_cast<PClassInventory>(CheckActorType(key));
				break;

			case NAME_Count:
				// Not yet implemented in the engine. Todo later
				check.Amount = CheckInt(key);
				break;
			}
		}

		node->ItemCheck.Push(check);
		return true;
	}